

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

uint16_t eia608_from_utf8_1(utf8_char_t *c,int chan)

{
  uint16_t uVar1;
  uint16_t cc_data;
  
  uVar1 = _eia608_from_utf8(c);
  if (uVar1 != 0) {
    cc_data = uVar1 | 0x800;
    if ((uVar1 & 0x6000) != 0) {
      cc_data = uVar1;
    }
    if (chan == 0) {
      cc_data = uVar1;
    }
    uVar1 = eia608_parity_word(cc_data);
    return uVar1;
  }
  return 0;
}

Assistant:

uint16_t eia608_from_utf8_1(const utf8_char_t* c, int chan)
{
    uint16_t cc_data = _eia608_from_utf8(c);

    if (0 == cc_data) {
        return cc_data;
    }

    if (chan && !eia608_is_basicna(cc_data)) {
        cc_data |= 0x0800;
    }

    return eia608_parity(cc_data);
}